

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O1

void set_slots_and_values(Am_Object *fake_start_object,Am_Value_List *slots_and_values_used)

{
  anon_union_8_8_ea4c8939_for_value aVar1;
  bool bVar2;
  Am_Value *in_value;
  Am_Wrapper *value;
  Am_Assoc as;
  Am_Value_List just_slots;
  Am_Value target_v;
  Am_Assoc local_68;
  Am_Value local_60;
  Am_Value_List local_50;
  Am_Value local_40;
  
  local_68.data = (Am_Assoc_Data *)0x0;
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Am_Value_List(&local_50);
  Am_Value_List::Start(slots_and_values_used);
  while( true ) {
    bVar2 = Am_Value_List::Last(slots_and_values_used);
    if (bVar2) {
      value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
      Am_Object::Set(fake_start_object,0xb8,value,1);
      Am_Value_List::~Am_Value_List(&local_50);
      Am_Value::~Am_Value(&local_40);
      Am_Assoc::~Am_Assoc(&local_68);
      return;
    }
    in_value = Am_Value_List::Get(slots_and_values_used);
    Am_Assoc::operator=(&local_68,in_value);
    if (local_68.data == (Am_Assoc_Data *)0x0) break;
    Am_Value::Am_Value(&local_60,&(local_68.data)->value_1);
    aVar1 = local_60.value;
    if ((2 < local_60.type - 1) && (local_60.type != 0x4015)) {
      Am_Error();
    }
    Am_Value::~Am_Value(&local_60);
    if (local_68.data == (Am_Assoc_Data *)0x0) {
      Am_Error("Accessing (nullptr) Assoc");
    }
    Am_Value::Am_Value(&local_60,&(local_68.data)->value_2);
    Am_Value::operator=(&local_40,&local_60);
    Am_Value::~Am_Value(&local_60);
    Am_Object::Set(fake_start_object,(Am_Slot_Key)aVar1.long_value,&local_40,1);
    Am_Value_List::Add(&local_50,(uint)aVar1.float_value & 0xffff,Am_TAIL,true);
    Am_Value_List::Next(slots_and_values_used);
  }
  Am_Error("Accessing (nullptr) Assoc");
}

Assistant:

void
set_slots_and_values(Am_Object &fake_start_object,
                     Am_Value_List &slots_and_values_used)
{
  Am_Assoc as;
  Am_Slot_Key key;
  Am_Value target_v;
  Am_Value_List just_slots;
  for (slots_and_values_used.Start(); !slots_and_values_used.Last();
       slots_and_values_used.Next()) {
    as = slots_and_values_used.Get();
    key = Am_Am_Slot_Key(as.Value_1());
    target_v = as.Value_2();
    fake_start_object.Set(key, target_v, Am_OK_IF_NOT_THERE);
    just_slots.Add((int)key);
  }
  fake_start_object.Set(Am_SLOTS_TO_SAVE, just_slots, Am_OK_IF_NOT_THERE);
}